

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstarClassic.cpp
# Opt level: O2

bool __thiscall
GMAA_MAAstarClassic::ConstructAndValuateNextPolicies
          (GMAA_MAAstarClassic *this,PartialPolicyPoolItemInterface_sharedPtr *ppi,
          PartialPolicyPoolInterface_sharedPtr *poolOfNextPolicies,bool *cleanUpPPI)

{
  BayesianGameIdenticalPayoff *bg;
  size_t *psVar1;
  string *__lhs;
  GeneralizedMAAStarPlanner *this_00;
  LIndex *pLVar2;
  size_t sVar3;
  size_t sVar4;
  QFunctionJAOHInterface *q;
  DecPOMDPDiscreteInterface *pDVar5;
  element_type *peVar6;
  undefined1 auVar7 [16];
  element_type *peVar8;
  bool bVar9;
  int iVar10;
  Index IVar11;
  BayesianGameForDecPOMDPStage *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LIndex i;
  reference pvVar12;
  size_t sVar13;
  ostream *poVar14;
  Index jt;
  uint agI;
  ulong uVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  PJPDP_sharedPtr jpolTs;
  PJPPV_sharedPtr jpolPrevTs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> firstOHtsI;
  JointPolicyPureVector jpolBG;
  JointPolicyPureVector bestLBjpolBG;
  stringstream ss;
  double local_3c0;
  string local_3a8;
  PartialPolicyPoolInterface_sharedPtr *local_388;
  LIndex local_380;
  double local_378;
  double local_370;
  ulong local_368;
  element_type *local_360;
  shared_count local_358;
  PartialPolicyPoolItemInterface_sharedPtr *local_350;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_348;
  double local_340;
  ulong local_338;
  TimedAlgorithm *local_330;
  ulong local_328;
  undefined1 local_320 [8];
  shared_count local_318;
  undefined1 local_310 [8];
  shared_count local_308;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_300;
  JointPolicyPureVector local_2e8;
  JointPolicyPureVector local_250;
  shared_ptr<PartialJointPolicyDiscretePure> local_1b8;
  ostream local_1a8 [376];
  
  *cleanUpPPI = true;
  local_388 = poolOfNextPolicies;
  local_350 = ppi;
  (*ppi->px->_vptr_PartialPolicyPoolItemInterface[2])(&local_1b8);
  boost::dynamic_pointer_cast<PartialJointPolicyPureVector,PartialJointPolicyDiscretePure>
            ((boost *)&local_360,&local_1b8);
  boost::detail::shared_count::~shared_count(&local_1b8.pn);
  peVar8 = local_360;
  sVar3 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
          super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
          _m_horizon;
  sVar4 = (local_360->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
          _m_depth;
  this_01 = (BayesianGameForDecPOMDPStage *)operator_new(0x150);
  q = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete)._m_qHeuristic;
  local_1b8.px = peVar8;
  local_1b8.pn.pi_ = local_358.pi_;
  if (local_358.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_358.pi_)->use_count_ = (local_358.pi_)->use_count_ + 1;
    UNLOCK();
  }
  BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
            (this_01,(PlanningUnitDecPOMDPDiscrete *)this,q,
             (shared_ptr<const_PartialJointPolicyDiscretePure> *)&local_1b8);
  boost::detail::shared_count::~shared_count(&local_1b8.pn);
  pDVar5 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
           super_PlanningUnitDecPOMDPDiscrete._m_DecPOMDP;
  auVar21 = (**(code **)(*(long *)((long)&pDVar5->field_0x0 + *(long *)(*(long *)pDVar5 + -0xb0)) +
                        0x70))((long)&pDVar5->field_0x0 + *(long *)(*(long *)pDVar5 + -0xb0));
  auVar18._0_8_ = auVar21._8_8_;
  auVar18._8_56_ = extraout_var_01;
  auVar7 = vcvtusi2sd_avx512f(auVar18._0_16_,sVar4);
  local_340 = pow(auVar21._0_8_,auVar7._0_8_);
  iVar10 = (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
             super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
             _vptr_PlanningUnit[6])(this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_300,
             CONCAT44(extraout_var,iVar10),(allocator_type *)&local_1b8);
  sVar3 = sVar3 - 1;
  agI = 0;
  while( true ) {
    iVar10 = (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
               super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
               _vptr_PlanningUnit[6])();
    if (CONCAT44(extraout_var_00,iVar10) <= (ulong)agI) break;
    i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                  ((PlanningUnitMADPDiscrete *)this,agI,(Index)sVar4);
    IVar11 = Globals::CastLIndexToIndex(i);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_300,
                         (ulong)agI);
    *pvVar12 = IVar11;
    agI = agI + 1;
  }
  bg = &this_01->super_BayesianGameIdenticalPayoff;
  local_380 = BayesianGameBase::GetNrJointPolicies((BayesianGameBase *)bg);
  sVar13 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)bg);
  psVar1 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
            super_GeneralizedMAAStarPlanner._m_bgCounter;
  *psVar1 = *psVar1 + 1;
  __lhs = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
           super_GeneralizedMAAStarPlanner._m_bgBaseFilename;
  bVar9 = std::operator!=(__lhs,"");
  if (bVar9) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    poVar14 = std::operator<<(local_1a8,(string *)__lhs);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
    std::__cxx11::stringbuf::str();
    BayesianGameIdenticalPayoff::Save(bg,(string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  }
  JointPolicyPureVector::JointPolicyPureVector
            (&local_2e8,(Interface_ProblemToPolicyDiscretePure *)bg);
  if (2 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).super_GeneralizedMAAStarPlanner
          ._m_verboseness) {
    poVar14 = std::operator<<((ostream *)&std::cout,"starting on solution of BG for t=");
    poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
    poVar14 = std::operator<<(poVar14," with nrJPols=");
    poVar14 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar14);
    std::endl<char,std::char_traits<char>>(poVar14);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  poVar14 = std::operator<<(local_1a8,"GMAA::NextExact_ts");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
  std::__cxx11::stringbuf::str();
  this_00 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
             super_GeneralizedMAAStarPlanner;
  TimedAlgorithm::StartTimer(&this_00->super_TimedAlgorithm,(string *)&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  JointPolicyPureVector::JointPolicyPureVector
            (&local_250,(Interface_ProblemToPolicyDiscretePure *)bg);
  local_330 = &this_00->super_TimedAlgorithm;
  (*(this_01->super_BayesianGameForDecPOMDPStageInterface).
    _vptr_BayesianGameForDecPOMDPStageInterface[3])(this_01,0);
  local_348 = &(this_01->super_BayesianGameIdenticalPayoff).
               super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrTypes;
  bVar9 = false;
  local_378 = -1.79769313486232e+308;
  local_3c0 = 0.0;
  uVar15 = 0;
  do {
    if (bVar9 != false) {
LAB_0043abc7:
      (*(this_01->super_BayesianGameForDecPOMDPStageInterface).
        _vptr_BayesianGameForDecPOMDPStageInterface[4])(this_01);
      if (sVar4 == sVar3) {
        (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
          super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
          _vptr_PlanningUnit[0x18])(&local_3a8,this,local_360,&local_250,local_348,&local_300);
        *(double *)(local_3a8._M_dataplus._M_p + 0x38) = local_3c0;
        peVar6 = local_388->px;
        (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
          super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
          _vptr_PlanningUnit[0x16])(local_378,local_320,this);
        (*peVar6->_vptr_PartialPolicyPoolInterface[8])(peVar6,local_320);
        boost::detail::shared_count::~shared_count(&local_318);
        boost::detail::shared_count::~shared_count((shared_count *)&local_3a8._M_string_length);
      }
      if (1 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
              super_GeneralizedMAAStarPlanner._m_verboseness) {
        poVar14 = std::operator<<((ostream *)&std::cout,"Solved BG for t=");
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
        poVar14 = std::operator<<(poVar14,". Max. expected value (including ");
        std::operator<<(poVar14,"true expected reward up to this ts:");
        poVar14 = std::ostream::_M_insert<double>
                            ((local_360->super_PartialJointPolicy)._m_pastReward);
        std::operator<<(poVar14,") is:");
        (*local_388->px->_vptr_PartialPolicyPoolInterface[4])(&local_3a8);
        dVar16 = (double)(**(code **)(*(long *)local_3a8._M_dataplus._M_p + 0x18))();
        poVar14 = std::ostream::_M_insert<double>(dVar16);
        std::endl<char,std::char_traits<char>>(poVar14);
        boost::detail::shared_count::~shared_count((shared_count *)&local_3a8._M_string_length);
      }
      (*(this_01->super_BayesianGameForDecPOMDPStageInterface).
        _vptr_BayesianGameForDecPOMDPStageInterface[1])(this_01);
      std::__cxx11::stringbuf::str();
      TimedAlgorithm::StopTimer(local_330,&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
      JointPolicyPureVector::~JointPolicyPureVector(&local_250);
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      JointPolicyPureVector::~JointPolicyPureVector(&local_2e8);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_300);
      boost::detail::shared_count::~shared_count(&local_358);
      return sVar4 == sVar3;
    }
    local_338 = uVar15;
    if (-1 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
             super_GeneralizedMAAStarPlanner._m_verboseness) {
      local_338 = uVar15 + 1;
      if ((10000 < uVar15) && (uVar15 % 10000 == 0)) {
        poVar14 = std::operator<<((ostream *)&std::cout,"BG joint policy");
        poVar14 = std::operator<<(poVar14," ");
        poVar14 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar14);
        poVar14 = std::operator<<(poVar14," of ");
        poVar14 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar14);
        poVar14 = std::operator<<(poVar14," - ");
        *(undefined8 *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 8) = 4;
        dVar16 = Globals::CastLIndexToDouble(uVar15);
        dVar17 = Globals::CastLIndexToDouble(local_380);
        poVar14 = std::ostream::_M_insert<double>((dVar16 / dVar17) * 100.0);
        poVar14 = std::operator<<(poVar14,"%");
        std::endl<char,std::char_traits<char>>(poVar14);
      }
    }
    auVar18 = ZEXT864(0) << 0x40;
    uVar15 = 0;
    local_368 = 0;
    local_3c0 = 0.0;
    while (uVar15 < sVar13) {
      IVar11 = JPolComponent_VectorImplementation::GetJointActionIndex
                         (&local_2e8.super_JPolComponent_VectorImplementation,(Index)uVar15);
      (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0xd])(bg,uVar15);
      local_370 = auVar18._0_8_;
      (*(this_01->super_BayesianGameForDecPOMDPStageInterface).
        _vptr_BayesianGameForDecPOMDPStageInterface[2])(this_01,uVar15,(ulong)IVar11,0);
      local_328 = auVar18._0_8_;
      (*(bg->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0x10])(bg,uVar15,(ulong)IVar11);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_3c0;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_370;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_368;
      uVar15 = (ulong)((Index)uVar15 + 1);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_328;
      auVar7 = vfmadd231sd_fma(auVar21,auVar19,auVar7);
      auVar21 = vfmadd231sd_fma(auVar20,auVar19,auVar18._0_16_);
      local_3c0 = auVar7._0_8_;
      local_368 = auVar21._0_8_;
    }
    dVar16 = (local_360->super_PartialJointPolicy)._m_pastReward;
    local_3c0 = local_3c0 * local_340 + dVar16;
    if (sVar4 == sVar3) {
      if (local_378 < local_3c0) {
        JointPolicyPureVector::operator=(&local_250,&local_2e8);
        local_378 = local_3c0;
      }
      dVar16 = local_3c0;
      (*local_350->px->_vptr_PartialPolicyPoolItemInterface[3])();
      if (dVar16 + -1e-08 <= local_3c0) {
        if (-1 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                 super_GeneralizedMAAStarPlanner._m_verboseness) {
          poVar14 = std::operator<<((ostream *)&std::cout,
                                    "GMAA_MAAstarClassic::ConstructAndValuateNextPolicies");
          poVar14 = std::operator<<(poVar14," Last time step, found tight bound: ");
          std::operator<<(poVar14,"found value v=");
          dVar16 = local_3c0;
          poVar14 = std::ostream::_M_insert<double>(local_3c0);
          std::operator<<(poVar14,", parent (upperbound) value=");
          (*local_350->px->_vptr_PartialPolicyPoolItemInterface[3])();
          poVar14 = std::ostream::_M_insert<double>(dVar16);
          std::endl<char,std::char_traits<char>>(poVar14);
        }
        goto LAB_0043abc7;
      }
    }
    else {
      local_370 = dVar16;
      (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
        super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
        _vptr_PlanningUnit[0x18])(&local_3a8,this,local_360,&local_2e8,local_348,&local_300);
      *(double *)(local_3a8._M_dataplus._M_p + 0x38) = local_3c0;
      peVar6 = local_388->px;
      (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
        super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
        _vptr_PlanningUnit[0x16])(local_310,this,&local_3a8);
      (*peVar6->_vptr_PartialPolicyPoolInterface[8])(peVar6,local_310);
      boost::detail::shared_count::~shared_count(&local_308);
      boost::detail::shared_count::~shared_count((shared_count *)&local_3a8._M_string_length);
    }
    bVar9 = JPolComponent_VectorImplementation::Increment
                      (&local_2e8.super_JPolComponent_VectorImplementation);
    pLVar2 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
              super_GeneralizedMAAStarPlanner._m_nrJPolBGsEvaluated;
    *pLVar2 = *pLVar2 + 1;
    uVar15 = local_338;
  } while( true );
}

Assistant:

bool GMAA_MAAstarClassic::ConstructAndValuateNextPolicies(
        const PartialPolicyPoolItemInterface_sharedPtr &ppi,
        const PartialPolicyPoolInterface_sharedPtr &poolOfNextPolicies,
        bool &cleanUpPPI)
{
    cleanUpPPI=true;
    //return(ConstructAndValuateNextPoliciesExactBG( ppi, poolOfNextPolicies));
    //moved this function here since MAA* is the only GMAA variant that does it
    //in this way...
    PJPPV_sharedPtr jpolPrevTs = 
        boost::dynamic_pointer_cast<PartialJointPolicyPureVector >(ppi->GetJPol());//jpol^ts-1
    size_t depth = jpolPrevTs->GetDepth(); // = depth = ts(jpolPrevTs) + 1
    size_t ts = depth; //jpol = jpol^ts-1, we construct BG for ts == depth
    bool is_last_ts = (ts ==  GetHorizon() - 1);

    // Construct the bayesian game for this timestep - 
    BayesianGameForDecPOMDPStage *bg_ts= new BayesianGameForDecPOMDPStage(
            this,
            _m_qHeuristic,
            jpolPrevTs
            );

    double discountToThePowerT = pow( GetDiscount(), (double)(ts) );
    vector<Index> firstOHtsI(GetNrAgents());
    for(Index agI=0; agI < GetNrAgents(); agI++)
        firstOHtsI.at(agI) = CastLIndexToIndex(GetFirstObservationHistoryIndex(agI, ts));
    const vector<size_t>& nrOHts = bg_ts->GetNrTypes(); 
    LIndex nrJPols = bg_ts->GetNrJointPolicies();
    size_t nrJT = bg_ts->GetNrJointTypes();

    _m_bgCounter++;
    if(_m_bgBaseFilename!="")
    {
        stringstream ss;
        ss << _m_bgBaseFilename << _m_bgCounter;
        BayesianGameIdenticalPayoff::Save(*bg_ts,ss.str());
    }

#if DEBUG_GMAA3
    if(_m_verboseness >= 3) {
        cout << "Constructed BG:"<<endl;
        bg_ts->Print();
    }
#endif


    //the policy for the Bayesian game 
    JointPolicyPureVector jpolBG = JointPolicyPureVector(bg_ts);

    if(_m_verboseness >= 3) 
        cout << "starting on solution of BG for t="<<ts<<" with nrJPols="
            <<nrJPols<<endl;

    stringstream ss;
    ss << "GMAA::NextExact_ts" << ts;
    StartTimer(ss.str());

    //some variables used when this is the last time-step
    double maxLBv = -DBL_MAX;
    JointPolicyPureVector bestLBjpolBG = JointPolicyPureVector(bg_ts);
    double newPastReward = 0.0;
    //we cache the immediate rewards in the BG...
    bg_ts->ComputeAllImmediateRewards();

    /* Do the full enumeration of all joint policies for the BG...*/
    bool carry_over = false;
    LIndex i = 0;
    while(!carry_over)
    {
        if(_m_verboseness >= 0)
            PrintProgress("BG joint policy", i++, nrJPols, 10000);
        //eval the expected future payoff of this jpolBG
        double f = 0.0;        
        double r = 0.0; //immediate reward (exact)
        for(Index jt = 0; jt < nrJT ; jt++)
        {
            Index jaI = jpolBG.GetJointActionIndex(jt);
            double jt_prob = bg_ts->GetProbability(jt);
            double jt_r = bg_ts->GetImmediateReward(jt, jaI);
            r += jt_prob * jt_r;
            double jt_util = bg_ts->GetUtility(jt, jaI);
            f += jt_prob * jt_util;
        }
        //add the expected reward for 0...ts-1
        //NOTE the expected reward has been computed as
        //f = R + gamma * F
        //by the heuristic. That means that f itself is not yet
        //discounted!!:
        double discounted_F = discountToThePowerT * f;
        double v = jpolPrevTs->GetPastReward() + discounted_F;
        // the new past reward:
        double discounted_r = discountToThePowerT * r;

#if DEBUG_GMAA4
        cout <<"v = pastReward_prevTs + g^t * f = "
                << v <<" = "
                << jpolPrevTs->GetPastReward() <<" + "
                << discounted_F << "   "
                << "(g^t * f ="<<discountToThePowerT << " * " << f << ")"
                << endl;
#endif

        newPastReward = jpolPrevTs->GetPastReward() + discounted_r;
        if(!is_last_ts) 
        {   
            //not the last time step...construct and return all 
            //partial DecPOMDP policies,
            
            // construct a policy for the DecPOMDP: a copy of jpolPrevTs
            // extended to this time step (ts) by jpolBG
            PJPDP_sharedPtr jpolTs = 
                ConstructExtendedJointPolicy(*jpolPrevTs,
                    jpolBG, nrOHts, firstOHtsI);
            jpolTs->SetPastReward(newPastReward);

            // wrap the policy and put it in the pool of next policies.
            // (these next policies are candidates to be added to the 
            // main policy pool)
            // Warning: jpolTs may have been deleted afterwards
            poolOfNextPolicies->Insert( NewPPI(jpolTs, v) );

            // conserve memory 
            // is this necessary?  - this is performed by 
            //      'SelectPoliciesToProcessFurther' 
            // seems like duplicate work...
            //if(poolOfNextPolicies->Size()>(_m_nrPoliciesToProcess*10))
                //Prune(poolOfNextPolicies,_m_nrPoliciesToProcess);
        }
        else
        {   
            //if using a heuristic that does not specify the exact immediate
            //reward, we still want to return the *EXACT* payoff here...
            v = newPastReward;
            //this is the last time step: 
            //  -values are lowerbounds, so if we find a policy with total 
            //      reward equal to the upperbound of the parent (ppi->
            //      GetValue() ) then we can stop evaluating other policies.
            //  -we will only need to return 1 policy and value
            //   (so we do not put them in a pool)
            if(v > maxLBv)
            {
                bestLBjpolBG = jpolBG;
                maxLBv = v;
            }
            if(v >= ppi->GetValue() - 1e-8)
            {
                if(_m_verboseness >= 0) 
                    cout << "GMAA_MAAstarClassic::ConstructAndValuateNextPolicies"<<
                        " Last time step, found tight bound: "<<
                        "found value v="<<v<<", parent (upperbound) value="<<
                        ppi->GetValue() << endl;
                break;
            }
        }
        carry_over = ++jpolBG; //next policy for the BG...
        _m_nrJPolBGsEvaluated++;
    }
    //empty the imm reward cache
    bg_ts->ClearAllImmediateRewards();

    //if this is the last time step, we have not constructed the Dec-POMDP
    //policy which will be returned yet, so we do this now:
    if(is_last_ts) 
    {
        PJPDP_sharedPtr jpolTs = ConstructExtendedJointPolicy(
                *jpolPrevTs,
                bestLBjpolBG, 
                nrOHts, 
                firstOHtsI
                );
        jpolTs->SetPastReward(newPastReward);
        // Warning: jpolTs may have been deleted afterwards
        poolOfNextPolicies->Insert( NewPPI(jpolTs, maxLBv ) );
    }

    if(_m_verboseness >= 2) 
        cout <<"Solved BG for t="<<ts<<". Max. expected value (including "
             <<"true expected reward up to this ts:"<<jpolPrevTs->GetPastReward()<<") is:"
             <<poolOfNextPolicies->Select()->GetValue() <<endl;

    delete(bg_ts);
    StopTimer(ss.str());
    //if we created a BG for the last time step t=h-1 - we have a lowerbound
    return(is_last_ts);

}